

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionElimination.cc
# Opt level: O2

bool flow::transform::eliminateLinearBr(IRHandler *handler)

{
  BasicBlock *this;
  BasicBlock *bb;
  pointer ppBVar1;
  TerminateInstr *pTVar2;
  long lVar3;
  byte bVar4;
  undefined8 in_RCX;
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *plVar5;
  _List_node_base *p_Var6;
  _func_int **local_30;
  
  plVar5 = &handler->blocks_;
  p_Var6 = (_List_node_base *)plVar5;
  do {
    do {
      bVar4 = (byte)in_RCX;
      p_Var6 = (((_List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                  *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var6 == (_List_node_base *)plVar5) goto LAB_0014462f;
      this = (BasicBlock *)p_Var6[1]._M_next;
      pTVar2 = BasicBlock::getTerminator(this);
    } while (pTVar2 == (TerminateInstr *)0x0);
    in_RCX = 0;
    lVar3 = __dynamic_cast(pTVar2,&TerminateInstr::typeinfo,&BrInstr::typeinfo);
  } while (lVar3 == 0);
  bb = (BasicBlock *)**(undefined8 **)(lVar3 + 0x50);
  ppBVar1 = (bb->predecessors_).
            super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((long)(bb->predecessors_).
             super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppBVar1 == 8) && (*ppBVar1 == this)) {
    BasicBlock::remove((BasicBlock *)&stack0xffffffffffffffd0,(char *)this);
    if (local_30 != (_func_int **)0x0) {
      (**(code **)(*local_30 + 8))();
    }
    local_30 = (_func_int **)0x0;
    BasicBlock::merge_back(this,bb);
    bVar4 = 1;
  }
  else {
    bVar4 = 0;
  }
LAB_0014462f:
  return (bool)(p_Var6 != (_List_node_base *)plVar5 & bVar4);
}

Assistant:

bool eliminateLinearBr(IRHandler* handler) {
  for (BasicBlock* bb : handler->basicBlocks()) {
    // attempt to eliminate useless linear br
    if (BrInstr* br = dynamic_cast<BrInstr*>(bb->getTerminator())) {
      if (br->targetBlock()->predecessors().size() != 1)
        return false;

      if (br->targetBlock()->predecessors().front() != bb)
        return false;

      // we are the only predecessor of BR's target block, so merge them
      BasicBlock* nextBB = br->targetBlock();

      // FLOW_TRACE("flow: eliminate linear BR-instruction from {} to {}", bb->name(), nextBB->name());

      // remove old terminator
      bb->remove(br);

      // merge nextBB
      bb->merge_back(nextBB);

      // destroy unused BB
      //bb->getHandler()->erase(nextBB);

      return true;
    }
  }

  return false;
}